

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_b12_sy_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined4 in_stack_00000030;
  undefined4 in_stack_00000040;
  uint16_t *in_stack_00000050;
  uint8_t *in_stack_000000e0;
  uint32_t in_stack_000000e8;
  int in_stack_000000f0;
  blend_unit_fn in_stack_000000f8;
  
  blend_a64_mask_bn_sy_w4_sse4_1
            (in_stack_00000050,dst._4_4_,(uint16_t *)CONCAT44(dst_stride,in_stack_00000040),
             src0._4_4_,(uint16_t *)CONCAT44(src0_stride,in_stack_00000030),src1._4_4_,
             in_stack_000000e0,in_stack_000000e8,in_stack_000000f0,in_stack_000000f8);
  return;
}

Assistant:

static void blend_a64_mask_b12_sy_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;
  blend_a64_mask_bn_sy_w4_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                 src1_stride, mask, mask_stride, h,
                                 blend_4_b12);
}